

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Store::Store(Store *this,Features *features)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  Ref ref;
  Ref local_28;
  Object *local_20;
  
  bVar2 = features->extended_const_enabled_;
  bVar3 = features->relaxed_simd_enabled_;
  bVar4 = features->custom_page_sizes_enabled_;
  (this->features_).multi_memory_enabled_ = features->multi_memory_enabled_;
  (this->features_).extended_const_enabled_ = bVar2;
  (this->features_).relaxed_simd_enabled_ = bVar3;
  (this->features_).custom_page_sizes_enabled_ = bVar4;
  bVar2 = features->mutable_globals_enabled_;
  bVar3 = features->sat_float_to_int_enabled_;
  bVar4 = features->sign_extension_enabled_;
  bVar5 = features->simd_enabled_;
  bVar6 = features->threads_enabled_;
  bVar7 = features->function_references_enabled_;
  bVar8 = features->multi_value_enabled_;
  bVar9 = features->tail_call_enabled_;
  bVar10 = features->bulk_memory_enabled_;
  bVar11 = features->reference_types_enabled_;
  bVar12 = features->annotations_enabled_;
  bVar13 = features->code_metadata_enabled_;
  bVar14 = features->gc_enabled_;
  bVar15 = features->memory64_enabled_;
  bVar16 = features->multi_memory_enabled_;
  (this->features_).exceptions_enabled_ = features->exceptions_enabled_;
  (this->features_).mutable_globals_enabled_ = bVar2;
  (this->features_).sat_float_to_int_enabled_ = bVar3;
  (this->features_).sign_extension_enabled_ = bVar4;
  (this->features_).simd_enabled_ = bVar5;
  (this->features_).threads_enabled_ = bVar6;
  (this->features_).function_references_enabled_ = bVar7;
  (this->features_).multi_value_enabled_ = bVar8;
  (this->features_).tail_call_enabled_ = bVar9;
  (this->features_).bulk_memory_enabled_ = bVar10;
  (this->features_).reference_types_enabled_ = bVar11;
  (this->features_).annotations_enabled_ = bVar12;
  (this->features_).code_metadata_enabled_ = bVar13;
  (this->features_).gc_enabled_ = bVar14;
  (this->features_).memory64_enabled_ = bVar15;
  (this->features_).multi_memory_enabled_ = bVar16;
  (this->gc_context_).call_depth = 0;
  (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->gc_context_).untraced_objects.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->gc_context_).untraced_objects.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->gc_context_).untraced_objects.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->threads_)._M_t._M_impl.super__Rb_tree_header;
  (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->threads_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->objects_).list_.
  super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects_).list_.
  super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects_).list_.
  super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objects_).free_head_ = 0;
  (this->objects_).free_items_ = 0;
  (this->roots_).list_.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->roots_).list_.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->roots_).list_.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->roots_).free_head_ = 0;
  (this->roots_).free_items_ = 0;
  local_20 = (Object *)operator_new(0x40);
  local_20->_vptr_Object = (_func_int **)&PTR__Object_00242600;
  local_20->kind_ = First;
  *(undefined8 *)&(local_20->finalizer_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(local_20->finalizer_).super__Function_base._M_functor + 8) = 0;
  (local_20->finalizer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (local_20->finalizer_)._M_invoker = (_Invoker_type)0x0;
  local_20->host_info_ = (void *)0x0;
  (local_20->self_).index = 0;
  local_28.index =
       FreeList<wabt::interp::Object*>::New<wabt::interp::Object*>
                 ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_20);
  if (local_28.index == 0) {
    FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this->roots_,&local_28);
    return;
  }
  __assert_fail("ref == Ref::Null",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0xdc,"wabt::interp::Store::Store(const Features &)");
}

Assistant:

Store::Store(const Features& features) : features_(features) {
  Ref ref{objects_.New(new Object(ObjectKind::Null))};
  assert(ref == Ref::Null);
  roots_.New(ref);
}